

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadGlobalHeader
          (BinaryReader *this,Type *out_type,bool *out_mutable)

{
  Result RVar1;
  undefined8 in_RAX;
  Enum EVar2;
  Type TVar3;
  undefined8 local_38;
  uint32_t type;
  uint8_t mutable_;
  
  local_38._4_4_ = (uint)((ulong)in_RAX >> 0x20) & 0xffffff;
  local_38 = (ulong)local_38._4_4_ << 0x20;
  RVar1 = ReadS32Leb128(this,(uint32_t *)&local_38,"global type");
  TVar3 = Void;
  if (RVar1.enum_ != Error) {
    TVar3 = (Type)local_38;
  }
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    if (((uint)(TVar3 + ~V128) < 4) ||
       ((TVar3 == V128 && ((this->options_->features).simd_enabled_ != false)))) {
      RVar1 = ReadU8(this,(uint8_t *)((long)&local_38 + 7),"global mutability");
      if (RVar1.enum_ != Error) {
        if (local_38._7_1_ < true) {
          *out_type = TVar3;
          *out_mutable = local_38._7_1_;
          EVar2 = Ok;
        }
        else {
          PrintError(this,"global mutability must be 0 or 1");
        }
      }
    }
    else {
      PrintError(this,"invalid global type: %#x",(ulong)(uint)TVar3);
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadGlobalHeader(Type* out_type, bool* out_mutable) {
  Type global_type = Type::Void;
  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadType(&global_type, "global type"));
  ERROR_UNLESS(IsConcreteType(global_type), "invalid global type: %#x",
               static_cast<int>(global_type));

  CHECK_RESULT(ReadU8(&mutable_, "global mutability"));
  ERROR_UNLESS(mutable_ <= 1, "global mutability must be 0 or 1");

  *out_type = global_type;
  *out_mutable = mutable_;
  return Result::Ok;
}